

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_defend(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CClass *this;
  CHAR_DATA *pCVar4;
  CHAR_DATA *in_RDI;
  char buf [4608];
  char arg [4608];
  CHAR_DATA *victim;
  char *in_stack_ffffffffffffdbd8;
  CHAR_DATA *ch_00;
  undefined4 in_stack_ffffffffffffdbe0;
  undefined4 in_stack_ffffffffffffdbe4;
  CHAR_DATA *in_stack_ffffffffffffdbe8;
  char_data *in_stack_ffffffffffffdbf0;
  int in_stack_ffffffffffffdcdc;
  CHAR_DATA *in_stack_ffffffffffffdce0;
  char *in_stack_ffffffffffffede0;
  char in_stack_ffffffffffffede8;
  undefined7 in_stack_ffffffffffffede9;
  
  one_argument((char *)CONCAT44(in_stack_ffffffffffffdbe4,in_stack_ffffffffffffdbe0),
               in_stack_ffffffffffffdbd8);
  iVar2 = get_skill(in_stack_ffffffffffffdce0,in_stack_ffffffffffffdcdc);
  if (iVar2 != 0) {
    iVar2 = (int)in_RDI->level;
    ch_00 = (CHAR_DATA *)(skill_table + gsn_defend);
    this = char_data::Class(in_stack_ffffffffffffdbf0);
    iVar3 = CClass::GetIndex(this);
    if (*(short *)((long)&ch_00->next_in_room + (long)iVar3 * 2) <= iVar2) {
      if (in_stack_ffffffffffffede8 == '\0') {
        if (in_RDI->defending == (CHAR_DATA *)0x0) {
          sprintf(&stack0xffffffffffffdbe8,"You aren\'t defending anyone right now.\n\r");
        }
        else {
          sprintf(&stack0xffffffffffffdbe8,"You are defending %s.\n\r",in_RDI->defending->name);
        }
        send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
        return;
      }
      pCVar4 = get_char_room((CHAR_DATA *)
                             CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),
                             in_stack_ffffffffffffede0);
      if (pCVar4 == (CHAR_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
        return;
      }
      if (pCVar4 == in_RDI) {
        send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
        in_RDI->defending = (CHAR_DATA *)0x0;
        return;
      }
      bVar1 = is_npc(ch_00);
      if (!bVar1) {
        if (in_RDI->defending != (CHAR_DATA *)0x0) {
          act((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8,
              (void *)CONCAT44(iVar2,in_stack_ffffffffffffdbe0),ch_00,0);
          act((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8,
              (void *)CONCAT44(iVar2,in_stack_ffffffffffffdbe0),ch_00,0);
        }
        act((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8,
            (void *)CONCAT44(iVar2,in_stack_ffffffffffffdbe0),ch_00,0);
        in_RDI->defending = pCVar4;
        act((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8,
            (void *)CONCAT44(iVar2,in_stack_ffffffffffffdbe0),ch_00,0);
        return;
      }
      send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
      return;
    }
  }
  send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
  return;
}

Assistant:

void do_defend(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	char arg[MAX_STRING_LENGTH];
	char buf[MAX_STRING_LENGTH];

	one_argument(argument, arg);
	if (get_skill(ch, gsn_defend) == 0 || ch->level < skill_table[gsn_defend].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You aren't able to defend other people.\n\r", ch);
		return;
	}

	if (arg[0] == '\0')
	{
		if (ch->defending == nullptr)
			sprintf(buf, "You aren't defending anyone right now.\n\r");
		else
			sprintf(buf, "You are defending %s.\n\r", ch->defending->name);

		send_to_char(buf, ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("You no longer defend anyone.\n\r", ch);
		ch->defending = nullptr;
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("They don't need to be defended.\n\r", ch);
		return;
	}

	if (ch->defending != nullptr)
	{
		act("You stop defending $N.", ch, 0, ch->defending, TO_CHAR);
		act("$n stops defending you.", ch, 0, ch->defending, TO_VICT);
	}

	act("You start defending $N.\n\r", ch, 0, victim, TO_CHAR);
	ch->defending = victim;
	act("$n is now defending you.", ch, 0, victim, TO_VICT);
}